

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1corr.c
# Opt level: O0

void run_test(_func_void *func,char *name,int req)

{
  bool bVar1;
  uint in_EDX;
  undefined8 in_RSI;
  code *in_RDI;
  int i;
  
  printf("TEST: %s\n",in_RSI);
  bVar1 = false;
  while (!bVar1) {
    hm_select(0);
    if ((hm_immutable & in_EDX) == 0) {
      printf(anon_var_dwarf_258,hm_name);
      bad = 0;
      (*in_RDI)();
      if (bad == 0) {
        printf(anon_var_dwarf_26e);
      }
    }
    else {
      printf(" \x1b[35m[\x1b[1m!\x1b[22m]\x1b[0m: %s\n",hm_name);
    }
    bVar1 = true;
  }
  return;
}

Assistant:

static void run_test(void (*func)(void), const char *name, int req)
{
    printf("TEST: %s\n", name);
    for (int i=0; i<ARRAYSZ(hms); i++)
    {
        hm_select(i);
        if (hm_immutable & req)
        {
            printf(" \e[35m[\e[1m!\e[22m]\e[0m: %s\n", hm_name);
            continue;
        }
        printf(" \e[34m[\e[1m⚒\e[22m]\e[0m: %s\n", hm_name);
        bad=0;
        func();
        if (!bad)
            printf("\e[F \e[32m[\e[1m✓\e[22m]\e[0m\n");
    }
}